

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

ON_Internal_ExtrudedEdge * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedEdge>::AppendNew(ON_SimpleArray<ON_Internal_ExtrudedEdge> *this)

{
  uint uVar1;
  int iVar2;
  ON_Internal_ExtrudedEdge *pOVar3;
  uint uVar4;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if ((int)uVar1 < 8 || (ulong)((long)(int)uVar1 << 6) < 0x10000001) {
      uVar4 = 4;
      if (2 < (int)uVar1) {
        uVar4 = uVar1 * 2;
      }
    }
    else {
      uVar4 = 0x400008;
      if ((int)uVar1 < 0x400008) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 + uVar1;
    }
    if ((uint)this->m_capacity < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
  }
  pOVar3 = this->m_a;
  iVar2 = this->m_count;
  pOVar3[iVar2].m_extruded_vertex[1] = (ON_Internal_ExtrudedVertex *)0x0;
  (pOVar3[iVar2].m_extruded_vertex + 1)[1] = (ON_Internal_ExtrudedVertex *)0x0;
  pOVar3[iVar2].m_copied_edge = (ON_SubDEdge *)0x0;
  (&pOVar3[iVar2].m_copied_edge)[1] = (ON_SubDEdge *)0x0;
  *(undefined8 *)&pOVar3[iVar2].m_side_group_id = 0;
  *(ON_SubDEdge **)(&pOVar3[iVar2].m_side_group_id + 2) = (ON_SubDEdge *)0x0;
  pOVar3 = pOVar3 + iVar2;
  pOVar3->m_initial_edge_tag = Unset;
  *(undefined3 *)&pOVar3->field_0x1 = 0;
  pOVar3->m_initial_vertex_id[0] = 0;
  *(undefined8 *)(pOVar3->m_initial_vertex_id + 1) = 0;
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}